

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.c
# Opt level: O3

uint lodepng_get_color_profile
               (LodePNGColorProfile *profile,uchar *in,uint w,uint h,LodePNGColorMode *mode_in)

{
  LodePNGColorType LVar1;
  byte g_00;
  byte bVar2;
  uchar a_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  undefined7 uVar9;
  byte bVar10;
  ulong in_R11;
  size_t sVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  unsigned_short g;
  unsigned_short b;
  unsigned_short r;
  unsigned_short a;
  ColorTree tree;
  unsigned_short local_11a;
  unsigned_short local_118;
  unsigned_short local_116;
  unsigned_short local_114;
  byte local_111;
  uint local_110;
  uchar local_10c;
  byte local_10b;
  byte local_10a;
  byte local_109;
  LodePNGColorProfile *local_108;
  ulong local_100;
  uint local_f4;
  LodePNGColorMode *local_f0;
  uchar *local_e8;
  uint local_dc;
  ulong local_d8;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  int local_38;
  
  local_100 = (ulong)h;
  LVar1 = mode_in->colortype;
  local_e8 = in;
  uVar3 = lodepng_can_have_alpha(mode_in);
  uVar13 = mode_in->bitdepth;
  iVar6 = 0;
  if ((ulong)LVar1 < 7) {
    iVar6 = *(int *)(&DAT_0013e16c + (ulong)LVar1 * 4);
  }
  local_100 = local_100 * w;
  local_f4 = iVar6 * uVar13;
  uVar4 = profile->bits;
  bVar15 = local_f4 == 1;
  uVar12 = profile->numcolors;
  uVar7 = (ulong)uVar12;
  local_cc = 0x101;
  if ((local_f4 < 9) && (local_cc = (1 << ((byte)local_f4 & 0x1f)) + uVar12, 0x100 < local_cc)) {
    local_cc = 0x101;
  }
  profile->numpixels = profile->numpixels + local_100;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_38 = -1;
  local_110 = 1;
  if (profile->alpha == 0) {
    local_110 = uVar3 ^ 1;
  }
  uVar3 = profile->colored;
  local_111 = local_f4 <= uVar4;
  bVar8 = local_cc <= uVar12 || uVar4 == 0x10;
  local_f0 = mode_in;
  local_d8 = uVar7;
  if (local_cc > uVar12 && uVar4 != 0x10) {
    if (uVar12 == 0) {
      local_d8 = 0;
    }
    else {
      uVar14 = 0;
      do {
        color_tree_add((ColorTree *)local_b8,profile->palette[uVar14 * 4],
                       profile->palette[uVar14 * 4 + 1],profile->palette[uVar14 * 4 + 2],
                       profile->palette[uVar14 * 4 + 3],(uint)uVar14);
        uVar14 = uVar14 + 1;
      } while (uVar14 < profile->numcolors);
      uVar13 = local_f0->bitdepth;
      local_d8 = (ulong)profile->numcolors;
    }
  }
  uVar12 = local_f4;
  uVar3 = (uint)(uVar3 != 0 || (LVar1 & ~LCT_GREY_ALPHA) == LCT_GREY);
  local_108 = profile;
  if ((uVar13 == 0x10) && (local_100 != 0)) {
    sVar11 = 0;
    do {
      getPixelColorRGBA16(&local_116,&local_11a,&local_118,&local_114,local_e8,sVar11,local_f0);
      if (((((local_116 & 0xff) != local_116 >> 8) || ((local_11a & 0xff) != local_11a >> 8)) ||
          ((local_118 & 0xff) != local_118 >> 8)) || ((local_114 & 0xff) != local_114 >> 8)) {
        profile->bits = 0x10;
        sVar11 = 0;
        local_116 = 0;
        local_11a = 0;
        local_118 = 0;
        local_114 = 0;
        uVar13 = local_110;
        goto LAB_0011ff32;
      }
      sVar11 = sVar11 + 1;
    } while (local_100 != sVar11);
  }
  local_116 = local_116 & 0xff00;
  local_11a = local_11a & 0xff00;
  local_118 = local_118 & 0xff00;
  local_114 = local_114 & 0xff00;
  if (local_100 != 0) {
    local_111 = local_111 | (bVar15 && uVar4 == 1);
    sVar11 = 0;
    do {
      getPixelColorRGBA8((uchar *)&local_116,(uchar *)&local_11a,(uchar *)&local_118,
                         (uchar *)&local_114,local_e8,sVar11,local_f0);
      uVar13 = profile->bits;
      bVar10 = (byte)local_116;
      if (uVar13 < 8 && (local_111 & 1) == 0) {
        uVar4 = 1;
        if ((1 < (byte)((byte)local_116 + 1)) && (uVar4 = 8, (byte)((byte)local_116 * -0xf) < 0x10))
        {
          uVar4 = (uint)(3 < (byte)((byte)local_116 * -3)) * 2 + 2;
        }
        if (uVar13 < uVar4) {
          profile->bits = uVar4;
          uVar13 = uVar4;
        }
      }
      local_111 = uVar12 <= uVar13;
      in_R11 = CONCAT71((int7)(in_R11 >> 8),1);
      uVar7 = CONCAT71((int7)(uVar7 >> 8),1);
      uVar4 = 1;
      g_00 = (byte)local_11a;
      bVar2 = (byte)local_118;
      uVar5 = uVar13;
      if (uVar3 == 0) {
        if ((byte)local_116 == (byte)local_11a) {
          uVar7 = 0;
          uVar4 = 0;
          if ((byte)local_116 == (byte)local_118) goto LAB_0011fb8d;
        }
        profile->colored = 1;
        uVar9 = (undefined7)(uVar7 >> 8);
        uVar7 = CONCAT71(uVar9,1);
        uVar4 = 1;
        if (uVar13 < 8) {
          profile->bits = 8;
          uVar5 = 8;
          uVar7 = CONCAT71(uVar9,1);
        }
      }
LAB_0011fb8d:
      a_00 = (uchar)local_114;
      if (local_110 == 0) {
        if ((profile->key_r == (local_116 & 0xff)) && (profile->key_g == (local_11a & 0xff))) {
          bVar15 = profile->key_b == (local_118 & 0xff);
        }
        else {
          bVar15 = false;
        }
        if ((uchar)local_114 == 0xff) {
          in_R11 = 0;
          local_110 = 0;
          if ((bool)(profile->key != 0 & bVar15)) {
            profile->alpha = 1;
            profile->key = 0;
            if (uVar5 < 8) goto LAB_0011fdcd;
            goto LAB_0011fb94;
          }
        }
        else {
          if (((uchar)local_114 != '\0') || (!(bool)(profile->key == 0 | bVar15))) {
            profile->alpha = 1;
            profile->key = 0;
            if (uVar5 < 8) {
LAB_0011fdcd:
              profile->bits = 8;
              goto LAB_0011fb94;
            }
            goto LAB_0011fb97;
          }
          in_R11 = 0;
          local_110 = 0;
          if (profile->key == 0 && profile->alpha == 0) {
            profile->key = 1;
            profile->key_r = local_116 & 0xff;
            profile->key_g = local_11a & 0xff;
            profile->key_b = local_118 & 0xff;
            in_R11 = 0;
            local_110 = 0;
          }
        }
      }
      else {
LAB_0011fb94:
        in_R11 = CONCAT71((int7)(in_R11 >> 8),1);
LAB_0011fb97:
        local_110 = 1;
      }
      bVar15 = true;
      if (bVar8) {
LAB_0011fba8:
        bVar8 = bVar15;
        bVar10 = (byte)in_R11 & bVar8;
        in_R11 = CONCAT71((int7)(in_R11 >> 8),bVar10);
        bVar10 = (byte)uVar7 & bVar10;
        uVar7 = CONCAT71((int7)(uVar7 >> 8),bVar10);
        uVar3 = uVar4;
        if ((bVar10 == 1) && (uVar12 <= uVar13)) break;
      }
      else {
        local_c4 = (uint)in_R11;
        local_c0 = (uint)uVar7;
        local_10a = (byte)local_116;
        local_109 = (byte)local_11a;
        local_c8 = (uint)(byte)local_118;
        local_dc = uVar4;
        local_bc = uVar13;
        iVar6 = color_tree_get((ColorTree *)local_b8,(byte)local_116,(byte)local_11a,(byte)local_118
                               ,(uchar)local_114);
        bVar8 = false;
        profile = local_108;
        uVar12 = local_f4;
        uVar3 = local_dc;
        if (iVar6 < 0) {
          local_10c = a_00;
          local_10b = bVar2;
          color_tree_add((ColorTree *)local_b8,bVar10,g_00,(uchar)local_c8,a_00,(uint)local_d8);
          uVar3 = local_108->numcolors;
          if ((ulong)uVar3 < 0x100) {
            uVar7 = (ulong)(uVar3 * 4);
            local_108->palette[(ulong)uVar3 * 4] = local_10a;
            local_108->palette[uVar7 + 1] = local_109;
            local_108->palette[uVar7 + 2] = local_10b;
            local_108->palette[uVar7 + 3] = local_10c;
          }
          uVar3 = uVar3 + 1;
          local_d8 = (ulong)uVar3;
          local_108->numcolors = uVar3;
          uVar7 = (ulong)local_c0;
          in_R11 = (ulong)local_c4;
          profile = local_108;
          uVar12 = local_f4;
          uVar13 = local_bc;
          uVar4 = local_dc;
          bVar15 = local_cc <= uVar3;
          goto LAB_0011fba8;
        }
      }
      sVar11 = sVar11 + 1;
    } while (local_100 != sVar11);
  }
  if ((profile->key != 0) && (local_108->alpha == 0 && local_100 != 0)) {
    sVar11 = 0;
    do {
      getPixelColorRGBA8((uchar *)&local_116,(uchar *)&local_11a,(uchar *)&local_118,
                         (uchar *)&local_114,local_e8,sVar11,local_f0);
      if (((((uchar)local_114 != '\0') && (local_108->key_r == (local_116 & 0xff))) &&
          (local_108->key_g == (local_11a & 0xff))) && (local_108->key_b == (local_118 & 0xff))) {
        local_108->alpha = 1;
        local_108->key = 0;
        if (local_108->bits < 8) {
          local_108->bits = 8;
        }
      }
      sVar11 = sVar11 + 1;
    } while (local_100 != sVar11);
  }
  uVar7._0_2_ = local_108->key_r;
  uVar7._2_2_ = local_108->key_g;
  uVar7._4_2_ = local_108->key_b;
  uVar7._6_2_ = *(undefined2 *)&local_108->field_0xe;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar7;
  auVar16 = psllw(auVar16,8);
  local_108->key_r = auVar16._0_2_ + (undefined2)uVar7;
  local_108->key_g = auVar16._2_2_ + uVar7._2_2_;
  local_108->key_b = (short)(*(int *)&local_108->key_b << 8) + (short)*(int *)&local_108->key_b;
LAB_0011fed8:
  color_tree_cleanup((ColorTree *)local_b8);
  return 0;
  while (sVar11 = sVar11 + 1, local_100 != sVar11) {
LAB_0011ff32:
    getPixelColorRGBA16(&local_116,&local_11a,&local_118,&local_114,local_e8,sVar11,local_f0);
    bVar15 = true;
    bVar8 = uVar3 == 0;
    uVar3 = 1;
    if (bVar8) {
      if (local_116 == local_11a) {
        bVar15 = false;
        uVar3 = 0;
        if (local_116 == local_118) goto LAB_0011ff91;
      }
      profile->colored = 1;
      bVar15 = true;
      uVar3 = 1;
    }
LAB_0011ff91:
    if (uVar13 == 0) {
      if ((local_116 == profile->key_r) && (local_11a == profile->key_g)) {
        bVar8 = local_118 == profile->key_b;
      }
      else {
        bVar8 = false;
      }
      if (local_114 == 0xffff) {
        uVar13 = 0;
        if ((bool)(profile->key != 0 & bVar8)) goto LAB_00120025;
      }
      else {
        if ((local_114 != 0) || (!(bool)(profile->key == 0 | bVar8))) {
LAB_00120025:
          profile->alpha = 1;
          profile->key = 0;
          goto LAB_00120035;
        }
        uVar13 = 0;
        if (profile->key == 0 && profile->alpha == 0) {
          profile->key = 1;
          profile->key_r = local_116;
          profile->key_g = local_11a;
          profile->key_b = local_118;
        }
      }
    }
    else {
LAB_00120035:
      uVar13 = 1;
      if (bVar15) break;
    }
  }
  if ((profile->key != 0) && (local_108->alpha == 0)) {
    sVar11 = 0;
    do {
      getPixelColorRGBA16(&local_116,&local_11a,&local_118,&local_114,local_e8,sVar11,local_f0);
      if ((((local_114 != 0) && (local_116 == local_108->key_r)) && (local_11a == local_108->key_g))
         && (local_118 == local_108->key_b)) {
        local_108->alpha = 1;
        local_108->key = 0;
      }
      sVar11 = sVar11 + 1;
    } while (local_100 != sVar11);
  }
  goto LAB_0011fed8;
}

Assistant:

unsigned lodepng_get_color_profile(LodePNGColorProfile* profile,
                                   const unsigned char* in, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode_in)
{
  unsigned error = 0;
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;

  /* mark things as done already if it would be impossible to have a more expensive case */
  unsigned colored_done = lodepng_is_greyscale_type(mode_in) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode_in) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode_in);
  unsigned bits_done = (profile->bits == 1 && bpp == 1) ? 1 : 0;
  unsigned sixteen = 0; /* whether the input image is 16 bit */
  unsigned maxnumcolors = 257;
  if(bpp <= 8) maxnumcolors = LODEPNG_MIN(257, profile->numcolors + (1u << bpp));

  profile->numpixels += numpixels;

  color_tree_init(&tree);

  /*If the profile was already filled in from previous data, fill its palette in tree
  and mark things as done already if we know they are the most expensive case already*/
  if(profile->alpha) alpha_done = 1;
  if(profile->colored) colored_done = 1;
  if(profile->bits == 16) numcolors_done = 1;
  if(profile->bits >= bpp) bits_done = 1;
  if(profile->numcolors >= maxnumcolors) numcolors_done = 1;

  if(!numcolors_done)
  {
    for(i = 0; i < profile->numcolors; i++)
    {
      const unsigned char* color = &profile->palette[i * 4];
      color_tree_add(&tree, color[0], color[1], color[2], color[3], i);
    }
  }

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode_in->bitdepth == 16 && !sixteen)
  {
    unsigned short r, g, b, a;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/
      {
        profile->bits = 16;
        sixteen = 1;
        bits_done = 1;
        numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/
        break;
      }
    }
  }

  if(sixteen)
  {
    unsigned short r = 0, g = 0, b = 0, a = 0;

    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 65535 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 65535 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
      }
      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
      }
    }
  }
  else /* < 16-bit */
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);

      if(!bits_done && profile->bits < 8)
      {
        /*only r is checked, < 8 bits is only relevant for greyscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > profile->bits) profile->bits = bits;
      }
      bits_done = (profile->bits >= bpp);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
        if(profile->bits < 8) profile->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 255 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 255 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done)
      {
        if(!color_tree_has(&tree, r, g, b, a))
        {
          color_tree_add(&tree, r, g, b, a, profile->numcolors);
          if(profile->numcolors < 256)
          {
            unsigned char* p = profile->palette;
            unsigned n = profile->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++profile->numcolors;
          numcolors_done = profile->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }
    }

    /*make the profile's key always 16-bit for consistency - repeat each byte twice*/
    profile->key_r += (profile->key_r << 8);
    profile->key_g += (profile->key_g << 8);
    profile->key_b += (profile->key_b << 8);
  }

  color_tree_cleanup(&tree);
  return error;
}